

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O0

void sc_core::sc_report_handler::report
               (sc_severity severity_,char *msg_type_,char *msg_,char *file_,int line_)

{
  sc_severity in_EDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  sc_msg_def *in_stack_00000010;
  sc_severity in_stack_0000001c;
  sc_report rep;
  sc_actions actions;
  sc_msg_def *md;
  char *in_stack_ffffffffffffff68;
  undefined1 local_88 [8];
  sc_report *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  sc_report *in_stack_ffffffffffffff90;
  uint local_34;
  sc_msg_def *local_30;
  
  local_30 = mdlookup(in_stack_ffffffffffffff68);
  if ((in_EDI != SC_INFO) || (199 < verbosity_level)) {
    if (local_30 == (sc_msg_def *)0x0) {
      local_30 = add_msg_type(in_stack_ffffffffffffff88);
    }
    local_34 = execute(local_30,in_EDI);
    sc_report::sc_report
              ((sc_report *)rep._0_8_,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
               unaff_retaddr,in_EDI,(int)rep.md);
    if ((local_34 & 0x10) != 0) {
      cache_report(in_stack_ffffffffffffff90);
    }
    (*(code *)handler)(local_88,&local_34);
    sc_report::~sc_report(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void sc_report_handler::report(sc_severity severity_,
			       const char * msg_type_,
			       const char * msg_,
			       const char * file_,
			       int line_)
{
    sc_msg_def * md = mdlookup(msg_type_);

    // If the severity of the report is SC_INFO and the maximum verbosity
    // level is less than SC_MEDIUM return without any action.

    if ( (severity_ == SC_INFO) && (SC_MEDIUM > verbosity_level) ) return;

    // Process the report:


    if ( !md )
	md = add_msg_type(msg_type_);

    sc_actions actions = execute(md, severity_);
    sc_report rep(severity_, md, msg_, file_, line_);

    if ( actions & SC_CACHE_REPORT )
	cache_report(rep);

    handler(rep, actions);
}